

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint addChunk_tRNS(ucvector *out,LodePNGColorMode *info)

{
  uint uVar1;
  uchar **chunk_00;
  int *in_RSI;
  uint error_2;
  uint error_1;
  uint error;
  size_t amount;
  size_t i;
  uchar *chunk;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  ucvector *in_stack_ffffffffffffffd0;
  ucvector *out_00;
  uchar **in_stack_ffffffffffffffd8;
  ucvector *puVar2;
  
  if (*in_RSI == 3) {
    out_00 = *(ucvector **)(in_RSI + 4);
    chunk_00 = *(uchar ***)(in_RSI + 4);
    while ((chunk_00 != (uchar **)0x0 &&
           (*(char *)(*(long *)(in_RSI + 2) + 3 + ((long)chunk_00 + -1) * 4) == -1))) {
      out_00 = (ucvector *)((long)&out_00[-1].allocsize + 7);
      chunk_00 = (uchar **)((long)chunk_00 + -1);
    }
    if (out_00 != (ucvector *)0x0) {
      uVar1 = lodepng_chunk_init(chunk_00,out_00,
                                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                 (char *)CONCAT44(in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0));
      if (uVar1 != 0) {
        return uVar1;
      }
      for (puVar2 = (ucvector *)0x0; puVar2 != out_00;
          puVar2 = (ucvector *)((long)&puVar2->data + 1)) {
        *(undefined1 *)&puVar2->size = *(undefined1 *)(*(long *)(in_RSI + 2) + 3 + (long)puVar2 * 4)
        ;
      }
    }
  }
  else if (*in_RSI == 0) {
    if (in_RSI[6] != 0) {
      uVar1 = lodepng_chunk_init(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                                 (char *)CONCAT44(in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0));
      if (uVar1 != 0) {
        return uVar1;
      }
      uRam0000000000000008 = (undefined1)((uint)in_RSI[7] >> 8);
      uRam0000000000000009 = (undefined1)in_RSI[7];
    }
  }
  else if ((*in_RSI == 2) && (in_RSI[6] != 0)) {
    uVar1 = lodepng_chunk_init(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                               (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                              );
    if (uVar1 != 0) {
      return uVar1;
    }
    uRam0000000000000008 = (undefined1)((uint)in_RSI[7] >> 8);
    uRam0000000000000009 = (undefined1)in_RSI[7];
    uRam000000000000000a = (undefined1)((uint)in_RSI[8] >> 8);
    uRam000000000000000b = (undefined1)in_RSI[8];
    uRam000000000000000c = (undefined1)((uint)in_RSI[9] >> 8);
    uRam000000000000000d = (undefined1)in_RSI[9];
  }
  return 0;
}

Assistant:

static unsigned addChunk_tRNS(ucvector* out, const LodePNGColorMode* info) {
  unsigned char* chunk = 0;

  if(info->colortype == LCT_PALETTE) {
    size_t i, amount = info->palettesize;
    /*the tail of palette values that all have 255 as alpha, does not have to be encoded*/
    for(i = info->palettesize; i != 0; --i) {
      if(info->palette[4 * (i - 1) + 3] != 255) break;
      --amount;
    }
    if(amount) {
      CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, amount, "tRNS"));
      /*add the alpha channel values from the palette*/
      for(i = 0; i != amount; ++i) chunk[8 + i] = info->palette[4 * i + 3];
    }
  } else if(info->colortype == LCT_GREY) {
    if(info->key_defined) {
      CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 2, "tRNS"));
      chunk[8] = (unsigned char)(info->key_r >> 8);
      chunk[9] = (unsigned char)(info->key_r & 255);
    }
  } else if(info->colortype == LCT_RGB) {
    if(info->key_defined) {
      CERROR_TRY_RETURN(lodepng_chunk_init(&chunk, out, 6, "tRNS"));
      chunk[8] = (unsigned char)(info->key_r >> 8);
      chunk[9] = (unsigned char)(info->key_r & 255);
      chunk[10] = (unsigned char)(info->key_g >> 8);
      chunk[11] = (unsigned char)(info->key_g & 255);
      chunk[12] = (unsigned char)(info->key_b >> 8);
      chunk[13] = (unsigned char)(info->key_b & 255);
    }
  }

  if(chunk) lodepng_chunk_generate_crc(chunk);
  return 0;
}